

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

void __thiscall google::protobuf::internal::MicroString::DestroySlow(MicroString *this)

{
  pointer pcVar1;
  LargeRepKind LVar2;
  StringRep *pSVar3;
  LargeRep *pLVar4;
  MicroRep *pMVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  
  if (((ulong)this->rep_ & 2) == 0) {
    LVar2 = large_rep_kind(this);
    if (LVar2 == kAlias) {
      pSVar3 = (StringRep *)large_rep(this);
      if (pSVar3 == (StringRep *)0x0) {
        return;
      }
      uVar7 = 0x10;
    }
    else if (LVar2 == kString) {
      pSVar3 = string_rep(this);
      if (pSVar3 == (StringRep *)0x0) {
        return;
      }
      pcVar1 = (pSVar3->str)._M_dataplus._M_p;
      paVar6 = &(pSVar3->str).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != paVar6) {
        operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
      }
      uVar7 = 0x30;
    }
    else {
      if (LVar2 != kOwned) {
        return;
      }
      pSVar3 = (StringRep *)large_rep(this);
      pLVar4 = large_rep(this);
      uVar7 = (ulong)pLVar4->capacity + 0x10;
    }
  }
  else {
    pSVar3 = (StringRep *)micro_rep(this);
    pMVar5 = micro_rep(this);
    uVar7 = (ulong)pMVar5->capacity + 2;
  }
  operator_delete(pSVar3,uVar7);
  return;
}

Assistant:

void MicroString::DestroySlow() {
  if (is_micro_rep()) {
    internal::SizedDelete(micro_rep(), MicroRepSize(micro_rep()->capacity));
    return;
  }

  switch (large_rep_kind()) {
    case kOwned:
      internal::SizedDelete(large_rep(), OwnedRepSize(large_rep()->capacity));
      break;
    case kString:
      delete string_rep();
      break;
    case kAlias:
      delete large_rep();
      break;
    case kUnowned:
      // Nothing to destroy.
      break;
  }
}